

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O1

Test * DepfileParserTestContinuation::Create(void)

{
  Test *pTVar1;
  
  pTVar1 = (Test *)operator_new(0x68);
  pTVar1->failed_ = false;
  pTVar1->assertion_failures_ = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DepfileParserTest_001d4930;
  DepfileParser::DepfileParser((DepfileParser *)(pTVar1 + 1));
  *(bool **)&pTVar1[4].failed_ = &pTVar1[5].failed_;
  pTVar1[5]._vptr_Test = (_func_int **)0x0;
  pTVar1[5].failed_ = false;
  pTVar1->_vptr_Test = (_func_int **)&PTR__DepfileParserTest_001d4238;
  g_current_test = pTVar1;
  return pTVar1;
}

Assistant:

TEST_F(DepfileParserTest, Continuation) {
  string err;
  EXPECT_TRUE(Parse(
"foo.o: \\\n"
"  bar.h baz.h\n",
      &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(1u, parser_.outs_.size());
  EXPECT_EQ("foo.o", parser_.outs_[0].AsString());
  EXPECT_EQ(2u, parser_.ins_.size());
}